

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O1

Vec_Int_t * Ga2_ManAbsTranslate(Ga2_Man_t *p)

{
  Gia_Obj_t *pObj;
  int iVar1;
  Gia_Man_t *p_00;
  ulong uVar2;
  Vec_Int_t *vClasses;
  int *__s;
  Vec_Int_t *pVVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  
  iVar1 = p->pGia->nObjs;
  vClasses = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar5 = iVar1;
  }
  vClasses->nSize = 0;
  vClasses->nCap = iVar5;
  if (iVar5 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar5 << 2);
  }
  vClasses->pArray = __s;
  vClasses->nSize = iVar1;
  if (__s != (int *)0x0) {
    memset(__s,0,(long)iVar1 << 2);
  }
  if (0 < iVar1) {
    *__s = 1;
    pVVar3 = p->vAbs;
    if (0 < pVVar3->nSize) {
      lVar7 = 0;
      do {
        iVar1 = pVVar3->pArray[lVar7];
        lVar4 = (long)iVar1;
        if (lVar4 < 0) {
LAB_005f678f:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        p_00 = p->pGia;
        if (p_00->nObjs <= iVar1) goto LAB_005f678f;
        if (p_00->pObjs == (Gia_Obj_t *)0x0) {
          return vClasses;
        }
        pObj = p_00->pObjs + lVar4;
        uVar2 = *(ulong *)pObj;
        uVar6 = (uint)uVar2;
        if ((~uVar6 & 0x1fffffff) == 0 || (int)uVar6 < 0) {
          if (((~uVar6 & 0x9fffffff) == 0) &&
             (p_00->vCis->nSize - p_00->nRegs <= (int)((uint)(uVar2 >> 0x20) & 0x1fffffff))) {
            if (p_00->nObjs <= iVar1) {
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            if (vClasses->nSize <= iVar1) goto LAB_005f67cd;
            vClasses->pArray[lVar4] = 1;
          }
          else if ((~uVar2 & 0x1fffffff1fffffff) != 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                          ,0x443,"Vec_Int_t *Ga2_ManAbsTranslate(Ga2_Man_t *)");
          }
        }
        else {
          Ga2_ManAbsTranslate_rec(p_00,pObj,vClasses,1);
        }
        lVar7 = lVar7 + 1;
        pVVar3 = p->vAbs;
      } while (lVar7 < pVVar3->nSize);
    }
    return vClasses;
  }
LAB_005f67cd:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

Vec_Int_t * Ga2_ManAbsTranslate( Ga2_Man_t * p )
{
    Vec_Int_t * vGateClasses;
    Gia_Obj_t * pObj;
    int i;
    vGateClasses = Vec_IntStart( Gia_ManObjNum(p->pGia) );
    Vec_IntWriteEntry( vGateClasses, 0, 1 );
    Gia_ManForEachObjVec( p->vAbs, p->pGia, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            Ga2_ManAbsTranslate_rec( p->pGia, pObj, vGateClasses, 1 );
        else if ( Gia_ObjIsRo(p->pGia, pObj) )
            Vec_IntWriteEntry( vGateClasses, Gia_ObjId(p->pGia, pObj), 1 );
        else if ( !Gia_ObjIsConst0(pObj) )
            assert( 0 );
//        Gia_ObjPrint( p->pGia, pObj );
    }
    return vGateClasses;
}